

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_ruleparser.h
# Opt level: O0

bool __thiscall BamTools::RuleParser::readToken(RuleParser *this,RuleToken *token)

{
  bool bVar1;
  bool bVar2;
  undefined4 *in_RSI;
  RuleParser *in_RDI;
  bool inOperandString;
  bool keepReading;
  char c;
  char local_19;
  bool local_1;
  
  skipSpaces(in_RDI);
  if (in_RDI->m_current == in_RDI->m_end) {
    local_1 = false;
  }
  else {
    std::__cxx11::string::clear();
    local_19 = '\x01';
    bVar1 = true;
    bVar2 = false;
    while (bVar1 && local_19 != '\0') {
      local_19 = getNextChar(in_RDI);
      if (local_19 == ' ') {
        bVar1 = false;
      }
      else if (local_19 == '!') {
        *in_RSI = 3;
        std::__cxx11::string::append((ulong)(in_RSI + 2),'\x01');
        bVar1 = false;
      }
      else if (local_19 == '&') {
        if (bVar2) {
          in_RDI->m_current = in_RDI->m_current + -1;
        }
        else {
          *in_RSI = 1;
          std::__cxx11::string::append((ulong)(in_RSI + 2),'\x01');
        }
        bVar1 = false;
      }
      else if (local_19 == '(') {
        *in_RSI = 4;
        std::__cxx11::string::append((ulong)(in_RSI + 2),'\x01');
        bVar1 = false;
      }
      else if (local_19 == ')') {
        if (bVar2) {
          in_RDI->m_current = in_RDI->m_current + -1;
        }
        else {
          *in_RSI = 5;
          std::__cxx11::string::append((ulong)(in_RSI + 2),'\x01');
        }
        bVar1 = false;
      }
      else if (local_19 == '|') {
        if (bVar2) {
          in_RDI->m_current = in_RDI->m_current + -1;
        }
        else {
          *in_RSI = 2;
          std::__cxx11::string::append((ulong)(in_RSI + 2),'\x01');
        }
        bVar1 = false;
      }
      else if (local_19 != '\0') {
        *in_RSI = 0;
        std::__cxx11::string::append((ulong)(in_RSI + 2),'\x01');
        bVar2 = true;
        bVar1 = true;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

inline bool RuleParser::readToken(RuleToken& token)
{

    // skip any preceding whitespace
    skipSpaces();
    if (m_current == m_end) return false;

    // clear out prior token value
    token.Value.clear();

    // read chars while still in token
    char c = 1;
    bool keepReading = true;
    bool inOperandString = false;
    while (keepReading && (c != 0)) {

        // get next char
        c = getNextChar();
        switch (c) {

            // current char is '('
            case (LEFT_PARENTHESIS_CHAR):
                token.Type = RuleToken::LEFT_PARENTHESIS;
                token.Value.append(1, LEFT_PARENTHESIS_CHAR);
                keepReading = false;
                break;

            // current char is ')'
            case (RIGHT_PARENTHESIS_CHAR):
                if (inOperandString)
                    --m_current;
                else {
                    token.Type = RuleToken::RIGHT_PARENTHESIS;
                    token.Value.append(1, RIGHT_PARENTHESIS_CHAR);
                }
                keepReading = false;
                break;

            // current char is '&'
            case (AND_OPERATOR_CHAR):
                if (inOperandString)
                    --m_current;
                else {
                    token.Type = RuleToken::AND_OPERATOR;
                    token.Value.append(1, AND_OPERATOR_CHAR);
                }
                keepReading = false;
                break;

            // current char is '|'
            case (OR_OPERATOR_CHAR):
                if (inOperandString)
                    --m_current;
                else {
                    token.Type = RuleToken::OR_OPERATOR;
                    token.Value.append(1, OR_OPERATOR_CHAR);
                }
                keepReading = false;
                break;

            // current char is '!'
            case (NOT_OPERATOR_CHAR):
                token.Type = RuleToken::NOT_OPERATOR;
                token.Value.append(1, NOT_OPERATOR_CHAR);
                keepReading = false;
                break;

            // current char is ' '
            case (SPACE_CHAR):
                keepReading = false;
                break;

            // current char is a true value token
            default:
                if (c != 0) {
                    token.Type = RuleToken::OPERAND;
                    token.Value.append(1, c);
                    inOperandString = true;
                    keepReading = true;
                }
        }
    }

    return true;
}